

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringExtras.cpp
# Opt level: O3

pair<llvm::StringRef,_llvm::StringRef> *
llvm::getToken(pair<llvm::StringRef,_llvm::StringRef> *__return_storage_ptr__,StringRef Source,
              StringRef Delimiters)

{
  size_type From;
  size_type sVar1;
  size_type sVar2;
  StringRef local_38;
  
  local_38.Length = Source.Length;
  local_38.Data = Source.Data;
  From = StringRef::find_first_not_of(&local_38,Delimiters,0);
  sVar1 = StringRef::find_first_of(&local_38,Delimiters,From);
  if (local_38.Length < From) {
    From = local_38.Length;
  }
  sVar2 = sVar1;
  if (sVar1 < From) {
    sVar2 = From;
  }
  if (local_38.Length < sVar1) {
    sVar2 = local_38.Length;
  }
  if (local_38.Length < sVar1) {
    sVar1 = local_38.Length;
  }
  (__return_storage_ptr__->first).Data = local_38.Data + From;
  (__return_storage_ptr__->first).Length = sVar2 - From;
  (__return_storage_ptr__->second).Data = local_38.Data + sVar1;
  (__return_storage_ptr__->second).Length = local_38.Length - sVar1;
  return __return_storage_ptr__;
}

Assistant:

std::pair<StringRef, StringRef> llvm::getToken(StringRef Source,
                                               StringRef Delimiters) {
  // Figure out where the token starts.
  StringRef::size_type Start = Source.find_first_not_of(Delimiters);

  // Find the next occurrence of the delimiter.
  StringRef::size_type End = Source.find_first_of(Delimiters, Start);

  return std::make_pair(Source.slice(Start, End), Source.substr(End));
}